

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(DescriptorKeyInfo *this,DescriptorKeyInfo *object)

{
  undefined3 uVar1;
  NetType NVar2;
  uint32_t uVar3;
  
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  (this->parent_info_)._M_dataplus._M_p = (pointer)&(this->parent_info_).field_2;
  (this->parent_info_)._M_string_length = 0;
  (this->parent_info_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  (this->key_string_)._M_dataplus._M_p = (pointer)&(this->key_string_).field_2;
  (this->key_string_)._M_string_length = 0;
  (this->key_string_).field_2._M_local_buf[0] = '\0';
  this->key_type_ = object->key_type_;
  ByteData::operator=(&(this->pubkey_).data_,&(object->pubkey_).data_);
  ByteData256::operator=(&(this->schnorr_pubkey_).data_,&(object->schnorr_pubkey_).data_);
  ByteData::operator=(&(this->privkey_).data_,&(object->privkey_).data_);
  uVar1 = *(undefined3 *)&(object->privkey_).field_0x19;
  NVar2 = (object->privkey_).net_type_;
  (this->privkey_).is_compressed_ = (object->privkey_).is_compressed_;
  *(undefined3 *)&(this->privkey_).field_0x19 = uVar1;
  (this->privkey_).net_type_ = NVar2;
  (this->extprivkey_).super_Extkey.version_ = (object->extprivkey_).super_Extkey.version_;
  ByteData::operator=(&(this->extprivkey_).super_Extkey.fingerprint_,
                      &(object->extprivkey_).super_Extkey.fingerprint_);
  uVar1 = *(undefined3 *)&(object->extprivkey_).super_Extkey.field_0x21;
  uVar3 = (object->extprivkey_).super_Extkey.child_num_;
  (this->extprivkey_).super_Extkey.depth_ = (object->extprivkey_).super_Extkey.depth_;
  *(undefined3 *)&(this->extprivkey_).super_Extkey.field_0x21 = uVar1;
  (this->extprivkey_).super_Extkey.child_num_ = uVar3;
  ByteData256::operator=
            (&(this->extprivkey_).super_Extkey.chaincode_,
             &(object->extprivkey_).super_Extkey.chaincode_);
  ByteData::operator=(&(this->extprivkey_).super_Extkey.privkey_.data_,
                      &(object->extprivkey_).super_Extkey.privkey_.data_);
  uVar1 = *(undefined3 *)&(object->extprivkey_).super_Extkey.privkey_.field_0x19;
  NVar2 = (object->extprivkey_).super_Extkey.privkey_.net_type_;
  (this->extprivkey_).super_Extkey.privkey_.is_compressed_ =
       (object->extprivkey_).super_Extkey.privkey_.is_compressed_;
  *(undefined3 *)&(this->extprivkey_).super_Extkey.privkey_.field_0x19 = uVar1;
  (this->extprivkey_).super_Extkey.privkey_.net_type_ = NVar2;
  ByteData::operator=(&(this->extprivkey_).super_Extkey.pubkey_.data_,
                      &(object->extprivkey_).super_Extkey.pubkey_.data_);
  ByteData256::operator=
            (&(this->extprivkey_).super_Extkey.tweak_sum_,
             &(object->extprivkey_).super_Extkey.tweak_sum_);
  (this->extpubkey_).super_Extkey.version_ = (object->extpubkey_).super_Extkey.version_;
  ByteData::operator=(&(this->extpubkey_).super_Extkey.fingerprint_,
                      &(object->extpubkey_).super_Extkey.fingerprint_);
  uVar1 = *(undefined3 *)&(object->extpubkey_).super_Extkey.field_0x21;
  uVar3 = (object->extpubkey_).super_Extkey.child_num_;
  (this->extpubkey_).super_Extkey.depth_ = (object->extpubkey_).super_Extkey.depth_;
  *(undefined3 *)&(this->extpubkey_).super_Extkey.field_0x21 = uVar1;
  (this->extpubkey_).super_Extkey.child_num_ = uVar3;
  ByteData256::operator=
            (&(this->extpubkey_).super_Extkey.chaincode_,
             &(object->extpubkey_).super_Extkey.chaincode_);
  ByteData::operator=(&(this->extpubkey_).super_Extkey.privkey_.data_,
                      &(object->extpubkey_).super_Extkey.privkey_.data_);
  uVar1 = *(undefined3 *)&(object->extpubkey_).super_Extkey.privkey_.field_0x19;
  NVar2 = (object->extpubkey_).super_Extkey.privkey_.net_type_;
  (this->extpubkey_).super_Extkey.privkey_.is_compressed_ =
       (object->extpubkey_).super_Extkey.privkey_.is_compressed_;
  *(undefined3 *)&(this->extpubkey_).super_Extkey.privkey_.field_0x19 = uVar1;
  (this->extpubkey_).super_Extkey.privkey_.net_type_ = NVar2;
  ByteData::operator=(&(this->extpubkey_).super_Extkey.pubkey_.data_,
                      &(object->extpubkey_).super_Extkey.pubkey_.data_);
  ByteData256::operator=
            (&(this->extpubkey_).super_Extkey.tweak_sum_,
             &(object->extpubkey_).super_Extkey.tweak_sum_);
  ::std::__cxx11::string::_M_assign((string *)&this->parent_info_);
  ::std::__cxx11::string::_M_assign((string *)&this->path_);
  ::std::__cxx11::string::_M_assign((string *)&this->key_string_);
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(const DescriptorKeyInfo& object) {
  key_type_ = object.key_type_;
  pubkey_ = object.pubkey_;
  schnorr_pubkey_ = object.schnorr_pubkey_;
  privkey_ = object.privkey_;
  extprivkey_ = object.extprivkey_;
  extpubkey_ = object.extpubkey_;
  parent_info_ = object.parent_info_;
  path_ = object.path_;
  key_string_ = object.key_string_;
}